

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_type.cpp
# Opt level: O0

OptimizerType duckdb::MetricsUtils::GetOptimizerTypeByMetric(MetricsType type)

{
  MetricsType type_local;
  OptimizerType local_4;
  
  switch(type) {
  case OPTIMIZER_EXPRESSION_REWRITER:
    local_4 = EXPRESSION_REWRITER;
    break;
  case OPTIMIZER_FILTER_PULLUP:
    local_4 = FILTER_PULLUP;
    break;
  case OPTIMIZER_FILTER_PUSHDOWN:
    local_4 = FILTER_PUSHDOWN;
    break;
  case OPTIMIZER_EMPTY_RESULT_PULLUP:
    local_4 = EMPTY_RESULT_PULLUP;
    break;
  case OPTIMIZER_CTE_FILTER_PUSHER:
    local_4 = CTE_FILTER_PUSHER;
    break;
  case OPTIMIZER_REGEX_RANGE:
    local_4 = REGEX_RANGE;
    break;
  case OPTIMIZER_IN_CLAUSE:
    local_4 = IN_CLAUSE;
    break;
  case OPTIMIZER_JOIN_ORDER:
    local_4 = JOIN_ORDER;
    break;
  case OPTIMIZER_DELIMINATOR:
    local_4 = DELIMINATOR;
    break;
  case OPTIMIZER_UNNEST_REWRITER:
    local_4 = UNNEST_REWRITER;
    break;
  case OPTIMIZER_UNUSED_COLUMNS:
    local_4 = UNUSED_COLUMNS;
    break;
  case OPTIMIZER_STATISTICS_PROPAGATION:
    local_4 = STATISTICS_PROPAGATION;
    break;
  case OPTIMIZER_COMMON_SUBEXPRESSIONS:
    local_4 = COMMON_SUBEXPRESSIONS;
    break;
  case OPTIMIZER_COMMON_AGGREGATE:
    local_4 = COMMON_AGGREGATE;
    break;
  case OPTIMIZER_COLUMN_LIFETIME:
    local_4 = COLUMN_LIFETIME;
    break;
  case OPTIMIZER_BUILD_SIDE_PROBE_SIDE:
    local_4 = BUILD_SIDE_PROBE_SIDE;
    break;
  case OPTIMIZER_LIMIT_PUSHDOWN:
    local_4 = LIMIT_PUSHDOWN;
    break;
  case OPTIMIZER_TOP_N:
    local_4 = TOP_N;
    break;
  case OPTIMIZER_COMPRESSED_MATERIALIZATION:
    local_4 = COMPRESSED_MATERIALIZATION;
    break;
  case OPTIMIZER_DUPLICATE_GROUPS:
    local_4 = DUPLICATE_GROUPS;
    break;
  case OPTIMIZER_REORDER_FILTER:
    local_4 = REORDER_FILTER;
    break;
  case OPTIMIZER_SAMPLING_PUSHDOWN:
    local_4 = SAMPLING_PUSHDOWN;
    break;
  case OPTIMIZER_JOIN_FILTER_PUSHDOWN:
    local_4 = JOIN_FILTER_PUSHDOWN;
    break;
  case OPTIMIZER_EXTENSION:
    local_4 = EXTENSION;
    break;
  case OPTIMIZER_MATERIALIZED_CTE:
    local_4 = MATERIALIZED_CTE;
    break;
  case OPTIMIZER_SUM_REWRITER:
    local_4 = SUM_REWRITER;
    break;
  case OPTIMIZER_LATE_MATERIALIZATION:
    local_4 = LATE_MATERIALIZATION;
    break;
  default:
    local_4 = INVALID;
  }
  return local_4;
}

Assistant:

OptimizerType MetricsUtils::GetOptimizerTypeByMetric(MetricsType type) {
    switch(type) {
        case MetricsType::OPTIMIZER_EXPRESSION_REWRITER:
            return OptimizerType::EXPRESSION_REWRITER;
        case MetricsType::OPTIMIZER_FILTER_PULLUP:
            return OptimizerType::FILTER_PULLUP;
        case MetricsType::OPTIMIZER_FILTER_PUSHDOWN:
            return OptimizerType::FILTER_PUSHDOWN;
        case MetricsType::OPTIMIZER_EMPTY_RESULT_PULLUP:
            return OptimizerType::EMPTY_RESULT_PULLUP;
        case MetricsType::OPTIMIZER_CTE_FILTER_PUSHER:
            return OptimizerType::CTE_FILTER_PUSHER;
        case MetricsType::OPTIMIZER_REGEX_RANGE:
            return OptimizerType::REGEX_RANGE;
        case MetricsType::OPTIMIZER_IN_CLAUSE:
            return OptimizerType::IN_CLAUSE;
        case MetricsType::OPTIMIZER_JOIN_ORDER:
            return OptimizerType::JOIN_ORDER;
        case MetricsType::OPTIMIZER_DELIMINATOR:
            return OptimizerType::DELIMINATOR;
        case MetricsType::OPTIMIZER_UNNEST_REWRITER:
            return OptimizerType::UNNEST_REWRITER;
        case MetricsType::OPTIMIZER_UNUSED_COLUMNS:
            return OptimizerType::UNUSED_COLUMNS;
        case MetricsType::OPTIMIZER_STATISTICS_PROPAGATION:
            return OptimizerType::STATISTICS_PROPAGATION;
        case MetricsType::OPTIMIZER_COMMON_SUBEXPRESSIONS:
            return OptimizerType::COMMON_SUBEXPRESSIONS;
        case MetricsType::OPTIMIZER_COMMON_AGGREGATE:
            return OptimizerType::COMMON_AGGREGATE;
        case MetricsType::OPTIMIZER_COLUMN_LIFETIME:
            return OptimizerType::COLUMN_LIFETIME;
        case MetricsType::OPTIMIZER_BUILD_SIDE_PROBE_SIDE:
            return OptimizerType::BUILD_SIDE_PROBE_SIDE;
        case MetricsType::OPTIMIZER_LIMIT_PUSHDOWN:
            return OptimizerType::LIMIT_PUSHDOWN;
        case MetricsType::OPTIMIZER_TOP_N:
            return OptimizerType::TOP_N;
        case MetricsType::OPTIMIZER_COMPRESSED_MATERIALIZATION:
            return OptimizerType::COMPRESSED_MATERIALIZATION;
        case MetricsType::OPTIMIZER_DUPLICATE_GROUPS:
            return OptimizerType::DUPLICATE_GROUPS;
        case MetricsType::OPTIMIZER_REORDER_FILTER:
            return OptimizerType::REORDER_FILTER;
        case MetricsType::OPTIMIZER_SAMPLING_PUSHDOWN:
            return OptimizerType::SAMPLING_PUSHDOWN;
        case MetricsType::OPTIMIZER_JOIN_FILTER_PUSHDOWN:
            return OptimizerType::JOIN_FILTER_PUSHDOWN;
        case MetricsType::OPTIMIZER_EXTENSION:
            return OptimizerType::EXTENSION;
        case MetricsType::OPTIMIZER_MATERIALIZED_CTE:
            return OptimizerType::MATERIALIZED_CTE;
        case MetricsType::OPTIMIZER_SUM_REWRITER:
            return OptimizerType::SUM_REWRITER;
        case MetricsType::OPTIMIZER_LATE_MATERIALIZATION:
            return OptimizerType::LATE_MATERIALIZATION;
    default:
            return OptimizerType::INVALID;
    };
}